

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenBuffer.cpp
# Opt level: O3

shared_ptr<Token> __thiscall TokenBuffer::tokenAt(TokenBuffer *this,size_t i)

{
  element_type *peVar1;
  _List_node_base *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  long *plVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  iterator __end1;
  shared_ptr<Token> sVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  element_type *local_48;
  shared_ptr<Token> *token;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  _Var3._M_pi = in_RDX;
  local_48 = (element_type *)this;
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(i + 0x10) <= in_RDX) {
    do {
      Tokenizer::currentToken(*(Tokenizer **)(i + 0x18));
      p_Var2 = (_List_node_base *)operator_new(0x20);
      p_Var5 = local_38;
      p_Var2[1]._M_next = (_List_node_base *)token;
      local_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var2[1]._M_prev = (_List_node_base *)p_Var5;
      token = (shared_ptr<Token> *)0x0;
      std::__detail::_List_node_base::_M_hook(p_Var2);
      *(long *)(i + 0x10) = *(long *)(i + 0x10) + 1;
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      }
      sVar6 = Tokenizer::nextToken((Tokenizer *)&stack0xffffffffffffffa8);
      _Var3 = sVar6.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
        _Var3._M_pi = extraout_RDX;
      }
    } while (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(i + 0x10) <= in_RDX);
  }
  peVar1 = local_48;
  (((_List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_> *)
   &(local_48->value)._M_dataplus)->_M_impl)._M_node.super__List_node_base._M_next =
       (_List_node_base *)0x0;
  (local_48->value)._M_string_length = 0;
  plVar4 = *(long **)i;
  if (plVar4 != (long *)i) {
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&in_RDX->_vptr__Sp_counted_base + 1);
    do {
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)(p_Var5 + 0xffffffffffffffff) + 0xf);
      if (p_Var5 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        (((_List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_> *)
         &(local_48->value)._M_dataplus)->_M_impl)._M_node.super__List_node_base._M_next =
             (_List_node_base *)plVar4[2];
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(local_48->value)._M_string_length
                   ,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(plVar4 + 3));
        _Var3._M_pi = extraout_RDX_00;
        break;
      }
      plVar4 = (long *)*plVar4;
    } while (plVar4 != (long *)i);
  }
  sVar6.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar6.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  return (shared_ptr<Token>)sVar6.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

const std::shared_ptr<Token> TokenBuffer::tokenAt(std::size_t i) noexcept {
  while (this->tokenList.size() <= i) {
    this->tokenList.push_back(this->tokenizer->currentToken());
    this->tokenizer->nextToken();
  }

  std::size_t numWalked = 0;
  std::shared_ptr<Token> token;

  for (const auto & it : this->tokenList) {
    if (numWalked == i) {
      token = it;
      break;
    }
    numWalked++;
  }

  return token;
}